

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::assignment_expr(analysis *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar4;
  int local_134 [2];
  allocator local_129;
  string local_128 [36];
  int local_104;
  undefined1 local_100 [8];
  NodePtr tmp_in_ptr;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  NodePtr tmp_cur_ptr;
  int local_a8;
  allocator local_a1;
  string local_a0 [36];
  int local_7c;
  shared_ptr<dh::TreeNode> local_78;
  token local_68;
  undefined1 local_38 [8];
  NodePtr tmp_ptr;
  NodePtr ret;
  analysis *this_local;
  
  std::shared_ptr<dh::TreeNode>::shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cond_or_expr((analysis *)local_38);
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  token::getVal_abi_cxx11_(&local_68);
  bVar1 = std::operator==(&local_68._val,"=");
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    local_7c = token::getLineno(peVar2);
    std::make_shared<dh::TreeNode,char_const(&)[2],int>((char (*) [2])&local_78,(int *)0x161308);
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)
               &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_78);
    std::shared_ptr<dh::TreeNode>::~shared_ptr(&local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"=",&local_a1);
    match(in_RSI,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    local_a8 = 1;
    TreeNode::setNodeKind(peVar3,&stack0xffffffffffffff58);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = 0;
    TreeNode::setKind(peVar3,(int *)((long)&tmp_cur_ptr.
                                            super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi + 4));
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    TreeNode::appendChild(peVar3,(NodePtr *)local_38);
    std::shared_ptr<dh::TreeNode>::shared_ptr
              ((shared_ptr<dh::TreeNode> *)local_c0,
               (shared_ptr<dh::TreeNode> *)
               &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    while( true ) {
      cond_or_expr((analysis *)local_d0);
      std::shared_ptr<dh::TreeNode>::operator=
                ((shared_ptr<dh::TreeNode> *)local_38,(shared_ptr<dh::TreeNode> *)local_d0);
      std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_d0);
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_
                ((token *)&tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tmp_in_ptr.
                               super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,"=");
      std::__cxx11::string::~string
                ((string *)
                 &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (!bVar1) break;
      peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      local_104 = token::getLineno(peVar2);
      std::make_shared<dh::TreeNode,char_const(&)[2],int>((char (*) [2])local_100,(int *)0x161308);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"=",&local_129);
      match(in_RSI,(string *)local_128);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_100);
      local_134[1] = 1;
      TreeNode::setNodeKind(peVar3,local_134 + 1);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_100);
      local_134[0] = 0;
      TreeNode::setKind(peVar3,local_134);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_100);
      TreeNode::appendChild(peVar3,(NodePtr *)local_38);
      peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c0);
      TreeNode::appendChild(peVar3,(NodePtr *)local_100);
      std::shared_ptr<dh::TreeNode>::operator=
                ((shared_ptr<dh::TreeNode> *)local_c0,(shared_ptr<dh::TreeNode> *)local_100);
      std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_100);
    }
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
    TreeNode::appendChild(peVar3,(NodePtr *)local_38);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_c0);
    std::shared_ptr<dh::TreeNode>::shared_ptr
              ((shared_ptr<dh::TreeNode> *)this,
               (shared_ptr<dh::TreeNode> *)
               &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::shared_ptr<dh::TreeNode>::shared_ptr
              ((shared_ptr<dh::TreeNode> *)this,(shared_ptr<dh::TreeNode> *)local_38);
  }
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_38);
  std::shared_ptr<dh::TreeNode>::~shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::assignment_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in assignment_expr\n";
#endif
	
	NodePtr ret;
	NodePtr tmp_ptr = cond_or_expr();

	if ( tmp->getVal() == "=")
	{
		ret = ::std::make_shared<TreeNode>("=",tmp->getLineno());
		match("=");
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::AssignK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = cond_or_expr();

			if ( tmp->getVal() == "=")
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>("=",tmp->getLineno());
				match("=");
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::AssignK);
				tmp_in_ptr->appendChild(tmp_ptr);

				tmp_cur_ptr->appendChild(tmp_in_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				tmp_cur_ptr->appendChild(tmp_ptr);
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}